

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  size_t in_RCX;
  void *__buf;
  
  QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>_>
  ::appendTo<QChar>(&p->a,out);
  HexString<unsigned_long_long>::write(&p->b,(int)out,__buf,in_RCX);
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }